

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.h
# Opt level: O3

string * ipx::Textline<char[35]>(string *__return_storage_ptr__,char (*text) [35])

{
  size_t sVar1;
  ostringstream s;
  undefined1 local_190 [24];
  undefined1 auStack_178 [88];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"    ",4);
  *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) =
       *(uint *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x18)) | 0x20;
  *(undefined8 *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x10)) = 0x34;
  sVar1 = strlen(*text);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,*text,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string Textline(const T& text) {
    std::ostringstream s;
    s << "    ";
    s.setf(std::ios_base::left);
    s.width(52);
    s << text;
    return s.str();
}